

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::MatchChar4Inst::Exec
          (MatchChar4Inst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar3 = *inputOffset;
  if (uVar3 < inputLength) {
    uVar2 = *(ulong *)(this->super_Char4Mixin).cs;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar2;
    uVar5 = (uint)(ushort)input[uVar3];
    auVar8 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
    auVar9._0_2_ = -(ushort)(auVar8._0_2_ == (short)uVar2);
    auVar9._2_2_ = -(ushort)(auVar8._2_2_ == (short)(uVar2 >> 0x10));
    auVar9._4_2_ = -(ushort)(auVar8._4_2_ == (short)(uVar2 >> 0x20));
    auVar9._6_2_ = -(ushort)(auVar8._6_2_ == (short)(uVar2 >> 0x30));
    auVar9._8_2_ = -(ushort)(auVar8._8_2_ == 0);
    auVar9._10_2_ = -(ushort)(auVar8._10_2_ == 0);
    auVar9._12_2_ = -(ushort)(auVar8._12_2_ == 0);
    auVar9._14_2_ = -(ushort)(auVar8._14_2_ == 0);
    auVar7 = pmovsxwd(auVar7,auVar9);
    iVar6 = movmskps(uVar5,auVar7);
    if (iVar6 != 0) {
      *inputOffset = uVar3 + 1;
      *instPointer = *instPointer + 9;
      return false;
    }
  }
  bVar4 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  return bVar4;
}

Assistant:

inline bool MatchChar4Inst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset >= inputLength || (input[inputOffset] != cs[0] && input[inputOffset] != cs[1] && input[inputOffset] != cs[2] && input[inputOffset] != cs[3]))
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }